

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

String * __thiscall
capnp::TextCodec::encode(String *__return_storage_ptr__,TextCodec *this,Reader *value)

{
  Reader value_00;
  Reader value_01;
  StringTree local_c0;
  ReaderFor<DynamicStruct> local_88;
  ReaderFor<DynamicList> local_50;
  
  if (this->prettyPrint == false) {
LAB_0020e202:
    kj::str<capnp::DynamicValue::Reader&>(__return_storage_ptr__,(kj *)value,value);
  }
  else {
    if (value->type == LIST) {
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_50,value);
      value_01.schema.elementType.field_4.schema = local_50.schema.elementType.field_4.schema;
      value_01.schema.elementType.baseType = local_50.schema.elementType.baseType;
      value_01.schema.elementType.listDepth = local_50.schema.elementType.listDepth;
      value_01.schema.elementType.isImplicitParam = local_50.schema.elementType.isImplicitParam;
      value_01.schema.elementType.field_3 = local_50.schema.elementType.field_3;
      value_01.schema.elementType._6_2_ = local_50.schema.elementType._6_2_;
      value_01.reader.segment = local_50.reader.segment;
      value_01.reader.capTable = local_50.reader.capTable;
      value_01.reader.ptr = local_50.reader.ptr;
      value_01.reader.elementCount = local_50.reader.elementCount;
      value_01.reader.step = local_50.reader.step;
      value_01.reader.structDataSize = local_50.reader.structDataSize;
      value_01.reader.structPointerCount = local_50.reader.structPointerCount;
      value_01.reader.elementSize = local_50.reader.elementSize;
      value_01.reader._39_1_ = local_50.reader._39_1_;
      value_01.reader.nestingLimit = local_50.reader.nestingLimit;
      value_01.reader._44_4_ = local_50.reader._44_4_;
      prettyPrint(value_01);
      kj::StringTree::flatten(__return_storage_ptr__,&local_c0);
    }
    else {
      if (value->type != STRUCT) goto LAB_0020e202;
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_88,value);
      value_00.reader.segment = local_88.reader.segment;
      value_00.schema.super_Schema.raw = local_88.schema.super_Schema.raw;
      value_00.reader.capTable = local_88.reader.capTable;
      value_00.reader.data = local_88.reader.data;
      value_00.reader.pointers = local_88.reader.pointers;
      value_00.reader.dataSize = local_88.reader.dataSize;
      value_00.reader.pointerCount = local_88.reader.pointerCount;
      value_00.reader._38_2_ = local_88.reader._38_2_;
      value_00.reader.nestingLimit = local_88.reader.nestingLimit;
      value_00.reader._44_4_ = local_88.reader._44_4_;
      prettyPrint(value_00);
      kj::StringTree::flatten(__return_storage_ptr__,&local_c0);
    }
    kj::StringTree::~StringTree(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String TextCodec::encode(DynamicValue::Reader value) const {
  if (!prettyPrint) {
    return kj::str(value);
  } else {
    if (value.getType() == DynamicValue::Type::STRUCT) {
      return capnp::prettyPrint(value.as<DynamicStruct>()).flatten();
    } else if (value.getType() == DynamicValue::Type::LIST) {
      return capnp::prettyPrint(value.as<DynamicList>()).flatten();
    } else {
      return kj::str(value);
    }
  }
}